

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

bool __thiscall
sentencepiece::string_util::lexical_cast<unsigned_long>
          (string_util *this,string_view arg,unsigned_long *result)

{
  bool bVar1;
  const_pointer pvVar2;
  ostream *poVar3;
  long *plVar4;
  bool local_1ca;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  ulong *local_20;
  unsigned_long *result_local;
  string_view arg_local;
  
  local_20 = (ulong *)arg._M_str;
  arg_local._M_len = arg._M_len;
  result_local = (unsigned_long *)this;
  std::__cxx11::stringstream::stringstream(local_1a8);
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&result_local);
  poVar3 = std::operator<<(local_198,pvVar2);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18)));
  local_1ca = false;
  if (bVar1) {
    plVar4 = (long *)std::istream::operator>>(local_1a8,local_20);
    local_1ca = std::ios::operator_cast_to_bool((ios *)((long)plVar4 + *(long *)(*plVar4 + -0x18)));
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return local_1ca;
}

Assistant:

inline bool lexical_cast(absl::string_view arg, Target *result) {
  std::stringstream ss;
  return (ss << arg.data() && ss >> *result);
}